

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileData.h
# Opt level: O3

void __thiscall Assimp::Q3BSP::Q3BSPModel::Q3BSPModel(Q3BSPModel *this)

{
  memset(this,0,0xc0);
  (this->m_ModelName)._M_dataplus._M_p = (pointer)&(this->m_ModelName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_ModelName,"");
  return;
}

Assistant:

Q3BSPModel() :
        m_Data(),
        m_Lumps(),
        m_Vertices(),
        m_Faces(),
        m_Indices(),
        m_Textures(),
        m_Lightmaps(),
        m_EntityData(),
        m_ModelName( "" )
    {
        // empty
    }